

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O0

SmodelsOutput * __thiscall
Potassco::SmodelsOutput::add(SmodelsOutput *this,Weight_t bnd,WeightLitSpan *lits,bool card)

{
  uint uVar1;
  size_t sVar2;
  undefined1 in_CL;
  Span<Potassco::WeightLit_t> *in_RDX;
  SmodelsOutput *in_RDI;
  uint size;
  uint neg;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar3;
  
  uVar3 = CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  uVar1 = anon_unknown_43::negSize<Potassco::WeightLit_t>
                    ((Span<Potassco::WeightLit_t> *)
                     (CONCAT44(CONCAT13(in_CL,in_stack_ffffffffffffffe4),in_stack_ffffffffffffffe0)
                     & 0x1ffffffffffffff));
  sVar2 = size<Potassco::WeightLit_t>(in_RDX);
  if ((uVar3 & 0x1000000) == 0) {
    add(in_RDI,in_stack_ffffffffffffffcc);
  }
  add(in_RDI,in_stack_ffffffffffffffcc);
  add(in_RDI,in_stack_ffffffffffffffcc);
  if ((uVar3 & 0x1000000) != 0) {
    add(in_RDI,in_stack_ffffffffffffffcc);
  }
  (anonymous_namespace)::print<Potassco::WeightLit_t,Potassco::(anonymous_namespace)::Atom>
            (in_RDI->os_,in_RDX,uVar1,(int)sVar2 - uVar1);
  if ((uVar3 & 0x1000000) == 0) {
    (anonymous_namespace)::print<Potassco::WeightLit_t,Potassco::(anonymous_namespace)::SmWeight>
              (in_RDI->os_,in_RDX,uVar1,(int)sVar2 - uVar1);
  }
  return in_RDI;
}

Assistant:

SmodelsOutput& SmodelsOutput::add(Weight_t bnd, const WeightLitSpan& lits, bool card) {
	unsigned neg = negSize(lits), size = static_cast<unsigned>(Potassco::size(lits));
	if (!card) { add(static_cast<unsigned>(bnd)); }
	add(size).add(neg);
	if (card)  { add(static_cast<unsigned>(bnd)); }
	print(os_, lits, neg, size - neg, Atom());
	if (!card) { print(os_, lits, neg, size - neg, SmWeight()); }
	return *this;
}